

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O3

void __thiscall CTestNet4Params::CTestNet4Params(CTestNet4Params *this)

{
  uint256 *puVar1;
  CBlock *this_00;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  undefined8 uVar3;
  uint uVar4;
  pointer puVar5;
  pointer psVar6;
  pointer puVar7;
  pointer pAVar8;
  pointer pAVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  base_blob<256U> *pbVar12;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_02;
  pointer puVar13;
  long lVar14;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar15;
  undefined8 *puVar16;
  CBlock *pCVar17;
  long in_FS_OFFSET;
  byte bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  span<const_std::byte,_18446744073709551615UL> b;
  initializer_list<std::pair<const_int,_uint256>_> __l;
  CAmount *in_stack_ffffffffffffff00;
  allocator_type local_f1;
  undefined8 local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  uchar local_c8 [16];
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [8];
  undefined1 local_a8 [9];
  uchar uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  _Base_ptr local_98;
  size_t local_90;
  undefined1 local_68 [16];
  pointer local_58;
  bool local_50;
  bool bStack_4f;
  bool local_4e;
  direct_or_indirect local_40;
  uint local_24;
  long local_20;
  
  bVar18 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  (this->super_CChainParams).m_chain_type = TESTNET4;
  (this->super_CChainParams).consensus.signet_blocks = false;
  puVar5 = (this->super_CChainParams).consensus.signet_challenge.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).consensus.signet_challenge.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (this->super_CChainParams).consensus.signet_challenge.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 210000;
  (this->super_CChainParams).consensus.BIP34Height = 1;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[8] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[9] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[10] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
  pbVar12 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0x10] = '\0';
  (pbVar12->m_data)._M_elems[0x11] = '\0';
  (pbVar12->m_data)._M_elems[0x12] = '\0';
  (pbVar12->m_data)._M_elems[0x13] = '\0';
  (pbVar12->m_data)._M_elems[0x14] = '\0';
  (pbVar12->m_data)._M_elems[0x15] = '\0';
  (pbVar12->m_data)._M_elems[0x16] = '\0';
  (pbVar12->m_data)._M_elems[0x17] = '\0';
  (pbVar12->m_data)._M_elems[0x18] = '\0';
  (pbVar12->m_data)._M_elems[0x19] = '\0';
  (pbVar12->m_data)._M_elems[0x1a] = '\0';
  (pbVar12->m_data)._M_elems[0x1b] = '\0';
  (pbVar12->m_data)._M_elems[0x1c] = '\0';
  (pbVar12->m_data)._M_elems[0x1d] = '\0';
  (pbVar12->m_data)._M_elems[0x1e] = '\0';
  (pbVar12->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.BIP65Height = 1;
  (this->super_CChainParams).consensus.BIP66Height = 1;
  (this->super_CChainParams).consensus.CSVHeight = 1;
  (this->super_CChainParams).consensus.SegwitHeight = 1;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xff;
  pbVar12 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[4] = 0xff;
  (pbVar12->m_data)._M_elems[5] = 0xff;
  (pbVar12->m_data)._M_elems[6] = 0xff;
  (pbVar12->m_data)._M_elems[7] = 0xff;
  pbVar12 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[8] = 0xff;
  (pbVar12->m_data)._M_elems[9] = 0xff;
  (pbVar12->m_data)._M_elems[10] = 0xff;
  (pbVar12->m_data)._M_elems[0xb] = 0xff;
  pbVar12 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0xc] = 0xff;
  (pbVar12->m_data)._M_elems[0xd] = 0xff;
  (pbVar12->m_data)._M_elems[0xe] = 0xff;
  (pbVar12->m_data)._M_elems[0xf] = 0xff;
  pbVar12 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0xc] = 0xff;
  (pbVar12->m_data)._M_elems[0xd] = 0xff;
  (pbVar12->m_data)._M_elems[0xe] = 0xff;
  (pbVar12->m_data)._M_elems[0xf] = 0xff;
  pbVar12 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0x10] = 0xff;
  (pbVar12->m_data)._M_elems[0x11] = 0xff;
  (pbVar12->m_data)._M_elems[0x12] = 0xff;
  (pbVar12->m_data)._M_elems[0x13] = 0xff;
  pbVar12 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0x14] = 0xff;
  (pbVar12->m_data)._M_elems[0x15] = 0xff;
  (pbVar12->m_data)._M_elems[0x16] = 0xff;
  (pbVar12->m_data)._M_elems[0x17] = 0xff;
  pbVar12 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0x18] = 0xff;
  (pbVar12->m_data)._M_elems[0x19] = 0xff;
  (pbVar12->m_data)._M_elems[0x1a] = 0xff;
  (pbVar12->m_data)._M_elems[0x1b] = 0xff;
  pbVar12 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0x1c] = '\0';
  (pbVar12->m_data)._M_elems[0x1d] = '\0';
  (pbVar12->m_data)._M_elems[0x1e] = '\0';
  (pbVar12->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x127500;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  (this->super_CChainParams).consensus.fPowAllowMinDifficultyBlocks = true;
  (this->super_CChainParams).consensus.enforce_BIP94 = true;
  (this->super_CChainParams).consensus.fPowNoRetargeting = false;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x5e8;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x7e0;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = -2;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = -1;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0;
  puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xba;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xf3;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\x02';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 'b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '.';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xd0;
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\x15';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 0xaa;
  (this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>.m_data._M_elems[8] =
       '_';
  pbVar12 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0x18] = '\0';
  (pbVar12->m_data)._M_elems[0x19] = '\0';
  (pbVar12->m_data)._M_elems[0x1a] = '\0';
  (pbVar12->m_data)._M_elems[0x1b] = '\0';
  (pbVar12->m_data)._M_elems[0x1c] = '\0';
  (pbVar12->m_data)._M_elems[0x1d] = '\0';
  (pbVar12->m_data)._M_elems[0x1e] = '\0';
  (pbVar12->m_data)._M_elems[0x1f] = '\0';
  pbVar12 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[9] = '\0';
  (pbVar12->m_data)._M_elems[10] = '\0';
  (pbVar12->m_data)._M_elems[0xb] = '\0';
  (pbVar12->m_data)._M_elems[0xc] = '\0';
  (pbVar12->m_data)._M_elems[0xd] = '\0';
  (pbVar12->m_data)._M_elems[0xe] = '\0';
  (pbVar12->m_data)._M_elems[0xf] = '\0';
  (pbVar12->m_data)._M_elems[0x10] = '\0';
  (pbVar12->m_data)._M_elems[0x11] = '\0';
  (pbVar12->m_data)._M_elems[0x12] = '\0';
  (pbVar12->m_data)._M_elems[0x13] = '\0';
  (pbVar12->m_data)._M_elems[0x14] = '\0';
  (pbVar12->m_data)._M_elems[0x15] = '\0';
  (pbVar12->m_data)._M_elems[0x16] = '\0';
  (pbVar12->m_data)._M_elems[0x17] = '\0';
  (pbVar12->m_data)._M_elems[0x18] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xfd;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0x81;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xf6;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xb6;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 't';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xb3;
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0x8d;
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\x1a';
  pbVar12 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[8] = '9';
  (pbVar12->m_data)._M_elems[9] = '\x11';
  (pbVar12->m_data)._M_elems[10] = 0xb3;
  (pbVar12->m_data)._M_elems[0xb] = 0xcf;
  (pbVar12->m_data)._M_elems[0xc] = 'g';
  (pbVar12->m_data)._M_elems[0xd] = 0xb6;
  (pbVar12->m_data)._M_elems[0xe] = 0x95;
  (pbVar12->m_data)._M_elems[0xf] = 'F';
  pbVar12 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0x10] = '|';
  (pbVar12->m_data)._M_elems[0x11] = 0xfe;
  (pbVar12->m_data)._M_elems[0x12] = 0x89;
  (pbVar12->m_data)._M_elems[0x13] = ']';
  (pbVar12->m_data)._M_elems[0x14] = 0xfa;
  (pbVar12->m_data)._M_elems[0x15] = 0x91;
  (pbVar12->m_data)._M_elems[0x16] = 0xb9;
  (pbVar12->m_data)._M_elems[0x17] = '}';
  pbVar12 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0x18] = '\x05';
  (pbVar12->m_data)._M_elems[0x19] = 'H';
  (pbVar12->m_data)._M_elems[0x1a] = 0xe3;
  (pbVar12->m_data)._M_elems[0x1b] = '[';
  pbVar12 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar12->m_data)._M_elems[0x1c] = '\0';
  (pbVar12->m_data)._M_elems[0x1d] = '\0';
  (pbVar12->m_data)._M_elems[0x1e] = '\0';
  (pbVar12->m_data)._M_elems[0x1f] = '\0';
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems = 0x283f161c;
  (this->super_CChainParams).nDefaultPort = 0xbccd;
  (this->super_CChainParams).nPruneAfterHeight = 1000;
  (this->super_CChainParams).m_assumed_blockchain_size = 1;
  (this->super_CChainParams).m_assumed_chain_state_size = 0;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_98 = (_Base_ptr)((ulong)local_98 & 0xffffffffffffff00);
  _local_a8 = (undefined1  [16])0x0;
  _local_b8 = (undefined1  [16])0x0;
  b._M_extent._M_extent_value = 0x21;
  b._M_ptr = local_b8;
  this_02 = &CScript::operator<<((CScript *)local_e8,b)->super_CScriptBase;
  uVar4 = this_02->_size;
  uVar10 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar10 = uVar4;
  }
  ppVar15 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (this_02->_union).indirect_contents.indirect;
  if (uVar4 < 0x1d) {
    ppVar15 = this_02;
  }
  local_f0 = CONCAT71(local_f0._1_7_,0xac);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_02,(uchar *)((long)&ppVar15->_union + (long)(int)uVar10),(uchar *)&local_f0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_40.indirect_contents,this_02
            );
  if (0x1c < (uint)local_d8._12_4_) {
    free((void *)local_e8._0_8_);
  }
  local_f0 = 5000000000;
  CreateGenesisBlock((CBlock *)local_b8,
                     "03/May/2024 000000000000000000001ebd58c244970b3aa9d783bb001011fbe8ea8e98e00e",
                     (CScript *)&local_40.indirect_contents,0x66356f04,0x17780cbb,0x1d00ffff,
                     (int32_t)&local_f0,in_stack_ffffffffffffff00);
  this_00 = &(this->super_CChainParams).genesis;
  puVar16 = (undefined8 *)local_b8;
  pCVar17 = this_00;
  for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
    uVar3 = *puVar16;
    (pCVar17->super_CBlockHeader).nVersion = (int)uVar3;
    (pCVar17->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
         (char)((ulong)uVar3 >> 0x20);
    (pCVar17->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
         (char)((ulong)uVar3 >> 0x28);
    (pCVar17->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
         (char)((ulong)uVar3 >> 0x30);
    (pCVar17->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
         (char)((ulong)uVar3 >> 0x38);
    puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
    pCVar17 = (CBlock *)((long)pCVar17 + (ulong)bVar18 * -0x10 + 8);
  }
  psVar6 = (this->super_CChainParams).genesis.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
  pvVar2 = &(this->super_CChainParams).genesis.vtx;
  local_e8._0_8_ =
       (pvVar2->
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_e8._8_8_ =
       (pvVar2->
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
  local_d8._0_8_ = psVar6;
  local_68 = (undefined1  [16])0x0;
  local_58 = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_e8);
  (this->super_CChainParams).genesis.m_checked_merkle_root = local_4e;
  (this->super_CChainParams).genesis.fChecked = local_50;
  (this->super_CChainParams).genesis.m_checked_witness_commitment = bStack_4f;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_68);
  CBlockHeader::GetHash((uint256 *)local_b8,&this_00->super_CBlockHeader);
  *(undefined8 *)
   ((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems +
   0x10) = local_a8._0_8_;
  *(_Base_ptr *)
   ((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems +
   0x18) = stack0xffffffffffffff60;
  *(undefined1 (*) [8])
   (this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems =
       local_b8;
  *(undefined1 (*) [8])
   ((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems + 8)
       = auStack_b0;
  auStack_b0[0] = 'V';
  local_b8 = (undefined1  [8])0x5be350b0da8bf043;
  auStack_b0[1] = '|';
  auStack_b0[2] = 0x86;
  auStack_b0[3] = 0x4b;
  auStack_b0[4] = 0x91;
  auStack_b0[5] = 0xf4;
  auStack_b0[6] = 0x7f;
  auStack_b0[7] = 0x50;
  stack0xffffffffffffff60 = (_Base_ptr)0xda84f2ba;
  local_a8._0_8_ = 0xfbbc53dee25a72ae;
  auVar20[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x10] == 0xae);
  auVar20[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x11] == 'r');
  auVar20[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x12] == 'Z');
  auVar20[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x13] == 0xe2);
  auVar20[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x14] == 0xde);
  auVar20[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x15] == 'S');
  auVar20[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x16] == 0xbc);
  auVar20[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x17] == 0xfb);
  auVar20[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x18] == 0xba);
  auVar20[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x19] == 0xf2);
  auVar20[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[0x1a] == 0x84);
  auVar20[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1b] == 0xda);
  auVar20[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1c] == '\0');
  auVar20[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1d] == '\0');
  auVar20[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1e] == '\0');
  auVar20[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1f] == '\0');
  auVar19[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0] == 'C');
  auVar19[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[1] == 0xf0);
  auVar19[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[2] == 0x8b);
  auVar19[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[3] == 0xda);
  auVar19[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[4] == 0xb0);
  auVar19[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[5] == 'P');
  auVar19[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[6] == 0xe3);
  auVar19[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[7] == '[');
  auVar19[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[8] == 'V');
  auVar19[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[9] == '|');
  auVar19[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[10] == 0x86);
  auVar19[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xb] == 'K');
  auVar19[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xc] == 0x91);
  auVar19[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xd] == 0xf4);
  auVar19[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xe] == '\x7f');
  auVar19[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xf] == 'P');
  auVar20 = auVar20 & auVar19;
  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"00000000da84f2bafbbc53dee25a72ae507ff4914b867c565be350b0da8bf043\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x16d,"CTestNet4Params::CTestNet4Params()");
  }
  auStack_b0[0] = 0xdb;
  local_b8 = (undefined1  [8])0x9102fe28912b7b4e;
  auStack_b0[1] = '\x06';
  auStack_b0[2] = 0x93;
  auStack_b0[3] = 0xaf;
  auStack_b0[4] = 0x2a;
  auStack_b0[5] = 0xe4;
  auStack_b0[6] = 0x18;
  auStack_b0[7] = 0xb7;
  local_a8[8] = '\x14';
  local_a8._0_8_ = (_Base_ptr)0xcb807e40cd57e667;
  uStack_9f = '4';
  uStack_9e = 0x22;
  uStack_9d = 0x1e;
  uStack_9c = 0xae;
  uStack_9b = 0xa7;
  uStack_9a = 0xa0;
  uStack_99 = 0x7a;
  auVar22[0] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) ==
                'g');
  auVar22[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x11) ==
                0xe6);
  auVar22[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x12) ==
                'W');
  auVar22[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x13) ==
                0xcd);
  auVar22[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x14) ==
                '@');
  auVar22[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x15) ==
                '~');
  auVar22[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x16) ==
                0x80);
  auVar22[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x17) ==
                0xcb);
  auVar22[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) ==
                '\x14');
  auVar22[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x19) ==
                '4');
  auVar22[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1a) ==
                 '\"');
  auVar22[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1b) ==
                  '\x1e');
  auVar22[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) ==
                  0xae);
  auVar22[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1d) ==
                  0xa7);
  auVar22[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1e) ==
                  0xa0);
  auVar22[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1f) ==
                  'z');
  auVar21[0] = -((this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                 super_base_blob<256U>.m_data._M_elems[0] == 'N');
  auVar21[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 1) == '{');
  auVar21[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 2) == '+');
  auVar21[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 3) == 0x91)
  ;
  auVar21[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 4) == '(');
  auVar21[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 5) == 0xfe)
  ;
  auVar21[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 6) ==
                '\x02');
  auVar21[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 7) == 0x91)
  ;
  auVar21[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) == 0xdb)
  ;
  auVar21[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 9) ==
                '\x06');
  auVar21[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 10) ==
                 0x93);
  auVar21[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xb) ==
                  0xaf);
  auVar21[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) ==
                  '*');
  auVar21[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xd) ==
                  0xe4);
  auVar21[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xe) ==
                  '\x18');
  auVar21[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xf) ==
                  0xb7);
  auVar21 = auVar21 & auVar22;
  if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"7aa0a7ae1e223414cb807e40cd57e667b718e42aaf9306db9102fe28912b7b4e\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x16e,"CTestNet4Params::CTestNet4Params()");
  }
  puVar5 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).vFixedSeeds.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (this->super_CChainParams).vFixedSeeds.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  this_01 = &(this->super_CChainParams).vSeeds;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_01,(this->super_CChainParams).vSeeds.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[36]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [36])"seed.testnet4.bitcoin.sprovoost.nl.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[23]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [23])"seed.testnet4.wiz.biz.");
  puVar13 = (pointer)operator_new(1);
  *puVar13 = 'o';
  puVar5 = (this->super_CChainParams).base58Prefixes[0].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (this->super_CChainParams).base58Prefixes[0].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar13;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar13 + 1;
  (this->super_CChainParams).base58Prefixes[0].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar13 + 1;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar7 - (long)puVar5);
  }
  puVar13 = (pointer)operator_new(1);
  *puVar13 = 0xc4;
  puVar5 = (this->super_CChainParams).base58Prefixes[1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (this->super_CChainParams).base58Prefixes[1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar13;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar13 + 1;
  (this->super_CChainParams).base58Prefixes[1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar13 + 1;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar7 - (long)puVar5);
  }
  puVar13 = (pointer)operator_new(1);
  *puVar13 = 0xef;
  puVar5 = (this->super_CChainParams).base58Prefixes[2].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (this->super_CChainParams).base58Prefixes[2].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar13;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar13 + 1;
  (this->super_CChainParams).base58Prefixes[2].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar13 + 1;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar7 - (long)puVar5);
  }
  local_b8._0_4_ = -0x3078cafc;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),local_b8);
  local_b8._0_4_ = 0x94833504;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(this->super_CChainParams).bech32_hrp,0,
             (this->super_CChainParams).bech32_hrp._M_string_length,"tb",2);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_b8,
             chainparams_seed_testnet4,(uchar *)"*seckeylen >= CKey::SIZE",
             (allocator_type *)local_e8);
  puVar5 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).vFixedSeeds.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_b8;
  (this->super_CChainParams).vFixedSeeds.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)auStack_b0;
  (this->super_CChainParams).vFixedSeeds.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_a8._0_8_;
  _local_b8 = (undefined1  [16])0x0;
  local_a8._0_8_ = (pointer)0x0;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar7 - (long)puVar5);
    if (local_b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_b8,local_a8._0_8_ - (long)local_b8);
    }
  }
  (this->super_CChainParams).fDefaultConsistencyChecks = false;
  (this->super_CChainParams).m_is_mockable_chain = false;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  __l._M_len = 1;
  __l._M_array = (iterator)local_e8;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            ((map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
             local_b8,__l,(less<int> *)&local_f0,&local_f1);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
           *)&(this->super_CChainParams).checkpointData);
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = auStack_b0._0_4_;
    *(undefined8 *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 8) = local_a8._0_8_;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) = stack0xffffffffffffff60;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) = local_98;
    *(_Rb_tree_header **)
     ((((AssumeutxoHash *)(local_a8._0_8_ + 4))->super_BaseHash<uint256>).m_hash.
      super_base_blob<256U>.m_data._M_elems + 4) =
         &(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
          super__Rb_tree_header;
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_90;
    local_a8._0_8_ = (pointer)0x0;
    local_90 = 0;
    local_98 = (_Base_ptr)(local_b8 + 8);
    unique0x10005097 = (_Base_ptr)(local_b8 + 8);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)local_b8);
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::vector
            ((vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)local_b8,
             (initializer_list<AssumeutxoData>)ZEXT816(0),(allocator_type *)local_e8);
  pAVar8 = (this->super_CChainParams).m_assumeutxo_data.
           super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar9 = (this->super_CChainParams).m_assumeutxo_data.
           super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).m_assumeutxo_data.
  super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b8;
  (this->super_CChainParams).m_assumeutxo_data.
  super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auStack_b0;
  (this->super_CChainParams).m_assumeutxo_data.
  super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_a8._0_8_;
  _local_b8 = (undefined1  [16])0x0;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = stack0xffffffffffffff60;
  _local_a8 = auVar11 << 0x40;
  if (pAVar8 != (pointer)0x0) {
    operator_delete(pAVar8,(long)pAVar9 - (long)pAVar8);
    if (local_b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_b8,local_a8._0_8_ - (long)local_b8);
    }
  }
  (this->super_CChainParams).chainTxData.nTime = 0x66bcd676;
  (this->super_CChainParams).chainTxData.tx_count = 0xb8ded;
  (this->super_CChainParams).chainTxData.dTxRate = 0.01570402633472492;
  if (0x1c < local_24) {
    free(local_40.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTestNet4Params() {
        m_chain_type = ChainType::TESTNET4;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.BIP34Height = 1;
        consensus.BIP34Hash = uint256{};
        consensus.BIP65Height = 1;
        consensus.BIP66Height = 1;
        consensus.CSVHeight = 1;
        consensus.SegwitHeight = 1;
        consensus.MinBIP9WarningHeight = 0;
        consensus.powLimit = uint256{"00000000ffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = true;
        consensus.enforce_BIP94 = true;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1512; // 75% for testchains
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Deployment of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = Consensus::BIP9Deployment::ALWAYS_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        consensus.nMinimumChainWork = uint256{"00000000000000000000000000000000000000000000005faa15d02e6202f3ba"};
        consensus.defaultAssumeValid = uint256{"000000005be348057db991fa5d89fe7c4695b667cfb311391a8db374b6f681fd"}; // 39550

        pchMessageStart[0] = 0x1c;
        pchMessageStart[1] = 0x16;
        pchMessageStart[2] = 0x3f;
        pchMessageStart[3] = 0x28;
        nDefaultPort = 48333;
        nPruneAfterHeight = 1000;
        m_assumed_blockchain_size = 1;
        m_assumed_chain_state_size = 0;

        const char* testnet4_genesis_msg = "03/May/2024 000000000000000000001ebd58c244970b3aa9d783bb001011fbe8ea8e98e00e";
        const CScript testnet4_genesis_script = CScript() << "000000000000000000000000000000000000000000000000000000000000000000"_hex << OP_CHECKSIG;
        genesis = CreateGenesisBlock(testnet4_genesis_msg,
                testnet4_genesis_script,
                1714777860,
                393743547,
                0x1d00ffff,
                1,
                50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"00000000da84f2bafbbc53dee25a72ae507ff4914b867c565be350b0da8bf043"});
        assert(genesis.hashMerkleRoot == uint256{"7aa0a7ae1e223414cb807e40cd57e667b718e42aaf9306db9102fe28912b7b4e"});

        vFixedSeeds.clear();
        vSeeds.clear();
        // nodes with support for servicebits filtering should be at the top
        vSeeds.emplace_back("seed.testnet4.bitcoin.sprovoost.nl."); // Sjors Provoost
        vSeeds.emplace_back("seed.testnet4.wiz.biz."); // Jason Maurice

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "tb";

        vFixedSeeds = std::vector<uint8_t>(std::begin(chainparams_seed_testnet4), std::end(chainparams_seed_testnet4));

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;

        checkpointData = {
            {
                {},
            }
        };

        m_assumeutxo_data = {
            {}
        };

        chainTxData = ChainTxData{
            // Data from RPC: getchaintxstats 4096 000000005be348057db991fa5d89fe7c4695b667cfb311391a8db374b6f681fd
            .nTime    = 1723651702,
            .tx_count = 757229,
            .dTxRate  = 0.01570402633472492,
        };
    }